

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O3

void __thiscall
FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor>::get_PictureEssenceCoding
          (FileInfoWrapper<AS_02::ACES::MXFReader,_MyACESPictureDescriptor> *this,FILE *stream)

{
  MDD_t MVar1;
  long *plVar2;
  undefined8 uVar3;
  long lVar4;
  CDCIEssenceDescriptor *cdci_descriptor;
  RGBAEssenceDescriptor *rgba_descriptor;
  Result_t result;
  long local_108;
  long local_100;
  int local_f8 [26];
  Result_t local_90 [104];
  
  ASDCP::DefaultCompositeDict();
  local_100 = 0;
  local_108 = 0;
  plVar2 = (long *)AS_02::ACES::MXFReader::OP1aHeader();
  MVar1 = ASDCP::DefaultCompositeDict();
  uVar3 = ASDCP::Dictionary::Type(MVar1);
  (**(code **)(*plVar2 + 0xa8))(local_f8,plVar2,uVar3,&local_100);
  lVar4 = local_100;
  if (local_f8[0] < 0 || local_100 == 0) {
    plVar2 = (long *)AS_02::ACES::MXFReader::OP1aHeader();
    MVar1 = ASDCP::DefaultCompositeDict();
    uVar3 = ASDCP::Dictionary::Type(MVar1);
    (**(code **)(*plVar2 + 0xa8))(local_90,plVar2,uVar3,&local_108);
    Kumu::Result_t::operator=((Result_t *)local_f8,local_90);
    Kumu::Result_t::~Result_t(local_90);
    lVar4 = local_108;
    if (local_f8[0] < 0 || local_108 == 0) goto LAB_0010bd0c;
  }
  (this->m_PictureEssenceCoding).super_Identifier<16U>.m_HasValue = *(bool *)(lVar4 + 0x218);
  uVar3 = *(undefined8 *)(lVar4 + 0x221);
  *(undefined8 *)(this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value =
       *(undefined8 *)(lVar4 + 0x219);
  *(undefined8 *)((this->m_PictureEssenceCoding).super_Identifier<16U>.m_Value + 8) = uVar3;
LAB_0010bd0c:
  Kumu::Result_t::~Result_t((Result_t *)local_f8);
  return;
}

Assistant:

void get_PictureEssenceCoding(FILE* stream = 0)
  {
    const Dictionary& Dict = DefaultCompositeDict();
    MXF::RGBAEssenceDescriptor *rgba_descriptor = 0;
    MXF::CDCIEssenceDescriptor *cdci_descriptor = 0;

    Result_t result = m_Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor),
							      reinterpret_cast<MXF::InterchangeObject**>(&rgba_descriptor));

    if ( KM_SUCCESS(result) && rgba_descriptor)
      m_PictureEssenceCoding = rgba_descriptor->PictureEssenceCoding;
    else{
    	result = m_Reader.OP1aHeader().GetMDObjectByType(DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor),
    								      reinterpret_cast<MXF::InterchangeObject**>(&cdci_descriptor));
        if ( KM_SUCCESS(result) && cdci_descriptor)
          m_PictureEssenceCoding = cdci_descriptor->PictureEssenceCoding;
    }
  }